

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::GZipFileSystem::OpenCompressedFile
          (GZipFileSystem *this,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle,
          bool write)

{
  pointer pFVar1;
  undefined7 in_register_00000011;
  string path;
  bool local_49;
  _func_int **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)CONCAT71(in_register_00000011,write));
  ::std::__cxx11::string::string((string *)&local_40,(string *)&pFVar1->path);
  make_uniq<duckdb::GZipFile,duckdb::unique_ptr<duckdb::FileHandle,std::default_delete<duckdb::FileHandle>,true>,std::__cxx11::string&,bool&>
            ((duckdb *)&local_48,
             (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             CONCAT71(in_register_00000011,write),&local_40,&local_49);
  (this->super_CompressedFileSystem).super_FileSystem._vptr_FileSystem = local_48;
  ::std::__cxx11::string::~string((string *)&local_40);
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> GZipFileSystem::OpenCompressedFile(unique_ptr<FileHandle> handle, bool write) {
	auto path = handle->path;
	return make_uniq<GZipFile>(std::move(handle), path, write);
}